

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O1

Float * __thiscall blc::math::Float::operator*(Float *__return_storage_ptr__,Float *this,double i)

{
  Float fl;
  Float local_50;
  Float local_38;
  
  Float(__return_storage_ptr__);
  Float(&local_38,i);
  operator*(&local_50,this,&local_38);
  __return_storage_ptr__->_nb = local_50._nb;
  __return_storage_ptr__->_E = local_50._E;
  return __return_storage_ptr__;
}

Assistant:

blc::math::Float blc::math::Float::operator*(double i) const {
	blc::math::Float ret;
	blc::math::Float fl(i);

	ret = *this * fl;
	return (ret);
}